

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

UnicodeString * icu_63::appendMillis(UDate date,UnicodeString *str)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int32_t digits [20];
  undefined4 uStack_6c;
  int local_68 [20];
  
  if (-1.84303902528e+17 <= date) {
    if (date <= 1.838821689216e+17) {
      uVar3 = (ulong)date;
    }
    else {
      uVar3 = 0x28d47dbbf19b000;
    }
  }
  else {
    uVar3 = 0xfd713893bf19b000;
  }
  uVar2 = -uVar3;
  if (0 < (long)uVar3) {
    uVar2 = uVar3;
  }
  lVar4 = 0;
  do {
    local_68[lVar4] = (int)uVar2 + (int)(uVar2 / 10) * -10;
    lVar4 = lVar4 + 1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if ((long)uVar3 < 0) {
    uStack_6c._2_2_ = 0x2d;
    UnicodeString::doAppend(str,(UChar *)((long)&uStack_6c + 2),0,1);
  }
  do {
    uStack_6c._2_2_ = (short)(&uStack_6c)[lVar4] + 0x30;
    UnicodeString::doAppend(str,(UChar *)((long)&uStack_6c + 2),0,1);
    lVar4 = lVar4 + -1;
  } while (0 < lVar4);
  return str;
}

Assistant:

static UnicodeString& appendMillis(UDate date, UnicodeString& str) {
    UBool negative = FALSE;
    int32_t digits[20]; // max int64_t is 20 decimal digits
    int32_t i;
    int64_t number;

    if (date < MIN_MILLIS) {
        number = (int64_t)MIN_MILLIS;
    } else if (date > MAX_MILLIS) {
        number = (int64_t)MAX_MILLIS;
    } else {
        number = (int64_t)date;
    }
    if (number < 0) {
        negative = TRUE;
        number *= -1;
    }
    i = 0;
    do {
        digits[i++] = (int32_t)(number % 10);
        number /= 10;
    } while (number != 0);

    if (negative) {
        str.append(MINUS);
    }
    i--;
    while (i >= 0) {
        str.append((UChar)(digits[i--] + 0x0030));
    }
    return str;
}